

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogToFile(int max_depth,char *filename)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  FILE *pFVar3;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *filename_local;
  int max_depth_local;
  
  pIVar1 = GImGui;
  if (((GImGui->LogEnabled & 1U) == 0) &&
     ((pIVar2 = GetCurrentWindowRead(), g = (ImGuiContext *)filename, filename != (char *)0x0 ||
      (g = (ImGuiContext *)(pIVar1->IO).LogFilename, g != (ImGuiContext *)0x0)))) {
    pFVar3 = ImFileOpen(&g->Initialized,"ab");
    pIVar1->LogFile = pFVar3;
    if (pIVar1->LogFile == (FILE *)0x0) {
      if (pIVar1->LogFile == (FILE *)0x0) {
        __assert_fail("g.LogFile != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                      ,0x1719,"void ImGui::LogToFile(int, const char *)");
      }
    }
    else {
      pIVar1->LogEnabled = true;
      pIVar1->LogStartDepth = (pIVar2->DC).TreeDepth;
      if (-1 < max_depth) {
        pIVar1->LogAutoExpandMaxDepth = max_depth;
      }
    }
  }
  return;
}

Assistant:

void ImGui::LogToFile(int max_depth, const char* filename)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;
    ImGuiWindow* window = GetCurrentWindowRead();

    if (!filename)
    {
        filename = g.IO.LogFilename;
        if (!filename)
            return;
    }

    g.LogFile = ImFileOpen(filename, "ab");
    if (!g.LogFile)
    {
        IM_ASSERT(g.LogFile != NULL); // Consider this an error
        return;
    }
    g.LogEnabled = true;
    g.LogStartDepth = window->DC.TreeDepth;
    if (max_depth >= 0)
        g.LogAutoExpandMaxDepth = max_depth;
}